

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int gmfsetblockf77_(int64_t *MshIdx,int *KwdCod,int *BegIdx,int *EndIdx,int *MapTyp,int *MatTab,
                   int *BegInt,int *EndInt,double *BegDbl,double *EndDbl,int *BegRef,int *EndRef)

{
  char cVar1;
  int KwdCod_00;
  long MshIdx_00;
  int iVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  int SizTab [1000];
  int TypTab [1000];
  char *BegTab [1000];
  char *EndTab [1000];
  
  MshIdx_00 = *MshIdx;
  KwdCod_00 = *KwdCod;
  lVar3 = (long)KwdCod_00 * 0x3300;
  iVar2 = 0;
  if (*(int *)(MshIdx_00 + 0x11c + lVar3) < 1000) {
    lVar3 = MshIdx_00 + lVar3;
    if (0 < *(int *)(lVar3 + 0x11c)) {
      uVar5 = 0;
      do {
        cVar1 = *(char *)(lVar3 + 0x10e8 + uVar5);
        if (cVar1 == 'r') {
          TypTab[uVar5] = 9;
          SizTab[uVar5] = 1;
          BegTab[uVar5] = (char *)BegDbl;
          pdVar4 = EndDbl;
LAB_0010af39:
          EndTab[uVar5] = (char *)pdVar4;
        }
        else if (cVar1 == 'i') {
          TypTab[uVar5] = 10;
          SizTab[uVar5] = 1;
          if ((""[KwdCod_00] == '\0') || (uVar5 != *(int *)(lVar3 + 0x11c) - 1)) {
            BegTab[uVar5] = (char *)BegInt;
            pdVar4 = (double *)(EndInt + uVar5);
          }
          else {
            BegTab[uVar5] = (char *)BegRef;
            pdVar4 = (double *)EndRef;
          }
          goto LAB_0010af39;
        }
        uVar5 = uVar5 + 1;
        EndDbl = EndDbl + 1;
        BegDbl = BegDbl + 1;
        BegInt = BegInt + 1;
      } while ((long)uVar5 < (long)*(int *)(lVar3 + 0x11c));
    }
    iVar2 = GmfSetBlock(MshIdx_00,KwdCod_00,(int64_t)BegTab,(int64_t)EndTab,*MapTyp,MatTab,
                        (void *)0x0,100,TypTab,SizTab,BegTab,EndTab);
  }
  return iVar2;
}

Assistant:

int APIF77(gmfsetblockf77)(int64_t *MshIdx, int *KwdCod,
                           int *BegIdx, int *EndIdx,
                           int *MapTyp, int *MatTab,
                           int *BegInt, int *EndInt,
                           double *BegDbl, double *EndDbl,
                           int *BegRef, int *EndRef)
{
   int         i, TypTab[ MaxArg ], SizTab[ MaxArg ];
   char        *BegTab[ MaxArg ], *EndTab[ MaxArg ];
   GmfMshSct   *msh = (GmfMshSct *)*MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ *KwdCod ];

   // Fortran mode will expand all fields as a separate scalar so we need space
   if(kwd->SolSiz >= MaxArg)
      return(0);

   // Fortran call to setblock uses the GmfArgTab mode where pointers are passed
   // through tables: types[], vec sizes[], begin pointers[] and end pointers[]
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'i')
      {
         TypTab[i] = GmfInt;
         SizTab[i] = 1;

         if( (F77RefFlg[ *KwdCod ]) && (i == kwd->SolSiz-1) )
         {
            BegTab[i] = (char *)BegRef;
            EndTab[i] = (char *)EndRef;
         }
         else
         {
            BegTab[i] = (char *)&BegInt[i];
            EndTab[i] = (char *)&EndInt[i];
         }
      }else if(kwd->fmt[i] == 'r')
      {
         TypTab[i] = GmfDouble;
         SizTab[i] = 1;
         BegTab[i] = (char *)&BegDbl[i];
         EndTab[i] = (char *)&EndDbl[i];
      }
   }

   return(GmfSetBlock(  *MshIdx, *KwdCod, *BegIdx, *EndIdx, *MapTyp, MatTab,
                        NULL, GmfArgTab, TypTab, SizTab, BegTab, EndTab ));
}